

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O3

int __thiscall P2PSocket::listen(P2PSocket *this,int __fd,int __n)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  long *plVar4;
  int *piVar5;
  long *plVar6;
  socklen_t *in_RCX;
  ulong *puVar7;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  sockaddr *extraout_RDX_01;
  int iVar8;
  ulong uVar9;
  ulong *puVar10;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar9 = (ulong)(uint)__fd;
  SocketResource::setNonBlockingMode(&this->m_socket);
  __addr = extraout_RDX;
  if (__fd < 1) {
    iVar8 = this->m_maxPeers;
    iVar3 = Peers::count(&this->m_peers);
    __fd = iVar8 - iVar3;
    __addr = extraout_RDX_00;
    if (__fd == 0 || iVar8 < iVar3) goto LAB_00109787;
  }
  iVar8 = __fd + 1;
  do {
    iVar3 = Peers::accept(&this->m_peers,(int)uVar9,__addr,in_RCX);
    if ((char)iVar3 == '\0') {
      plVar4 = (long *)__cxa_allocate_exception(0x20);
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Accept failure ","");
      piVar5 = __errno_location();
      strerror(*piVar5);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_48);
      puVar7 = (ulong *)*plVar6;
      puVar10 = (ulong *)(plVar6 + 2);
      if (puVar7 == puVar10) {
        local_58 = *puVar10;
        uStack_50 = (undefined4)plVar6[3];
        uStack_4c = *(undefined4 *)((long)plVar6 + 0x1c);
        puVar7 = &local_58;
      }
      else {
        local_58 = *puVar10;
      }
      lVar1 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      *plVar4 = (long)(plVar4 + 2);
      if (puVar7 == &local_58) {
        *(undefined4 *)(plVar4 + 2) = (undefined4)local_58;
        *(undefined4 *)((long)plVar4 + 0x14) = local_58._4_4_;
        *(undefined4 *)(plVar4 + 3) = uStack_50;
        *(undefined4 *)((long)plVar4 + 0x1c) = uStack_4c;
      }
      else {
        *plVar4 = (long)puVar7;
        plVar4[2] = local_58;
      }
      plVar4[1] = lVar1;
      local_58 = local_58 & 0xffffffffffffff00;
      __cxa_throw(plVar4,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
    }
    iVar8 = iVar8 + -1;
    __addr = extraout_RDX_01;
  } while (iVar8 != 0);
LAB_00109787:
  bVar2 = SocketResource::setBlockMode(&this->m_socket);
  return (int)CONCAT71(extraout_var,bVar2);
}

Assistant:

void P2PSocket::listen(int queue)
{
    m_socket.setNonBlockingMode();
    int remain = queue > 0 ? queue : m_maxPeers - m_peers.count();
    if (remain > 0) {
        for (int i = 0; i <= remain; ++i) {
            if (!m_peers.accept())
                throw P2PSocketException(std::string{"Accept failure "} + std::strerror(errno));
        }
    }
    m_socket.setBlockMode();
}